

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_iterate(void **param_1)

{
  roaring64_bitmap_t *file;
  char *in_RDI;
  uint64_t sum;
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *in_stack_00000080;
  void *in_stack_00000098;
  roaring_iterator64 in_stack_000000a0;
  roaring64_bitmap_t *in_stack_000000a8;
  int line;
  
  file = roaring64_bitmap_create();
  roaring64_bitmap_add((roaring64_bitmap_t *)sum,(uint64_t)in_RDI);
  roaring64_bitmap_add((roaring64_bitmap_t *)sum,(uint64_t)in_RDI);
  roaring64_bitmap_add((roaring64_bitmap_t *)sum,(uint64_t)in_RDI);
  roaring64_bitmap_add((roaring64_bitmap_t *)sum,(uint64_t)in_RDI);
  roaring64_bitmap_add((roaring64_bitmap_t *)sum,(uint64_t)in_RDI);
  line = 0;
  roaring64_bitmap_iterate(in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
  _assert_true(sum,in_RDI,(char *)file,line);
  _assert_int_equal(sum,(unsigned_long)in_RDI,(char *)file,line);
  roaring64_bitmap_free(in_stack_00000080);
  return;
}

Assistant:

DEFINE_TEST(test_iterate) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();

    roaring64_bitmap_add(r, 0);
    roaring64_bitmap_add(r, 1ULL << 35);
    roaring64_bitmap_add(r, (1Ull << 35) + 1);
    roaring64_bitmap_add(r, (1Ull << 35) + 2);
    roaring64_bitmap_add(r, (1Ull << 36));

    uint64_t sum = 0;
    assert_true(roaring64_bitmap_iterate(r, roaring_iterator64_sumall, &sum));
    assert_int_equal(sum, ((1ULL << 35) + (1ULL << 35) + 1 + (1ULL << 35) + 2 +
                           (1ULL << 36)));

    roaring64_bitmap_free(r);
}